

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall CList::insert(CList *this,AbstractSearchState *AbstractSearchState1,int listindex)

{
  SBPL_Exception *this_00;
  char *what_arg;
  long *plVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  listelement *insertelem;
  char *in_stack_ffffffffffffffb8;
  SBPL_Exception *in_stack_ffffffffffffffc0;
  
  if (4999999 < (int)in_RDI[2]) {
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_00,in_stack_ffffffffffffffb8);
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  if (*(long *)(in_RSI + (long)in_EDX * 8) != 0) {
    what_arg = (char *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffffc0,what_arg);
    __cxa_throw(what_arg,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  plVar1 = (long *)malloc(0x18);
  *plVar1 = in_RSI;
  plVar1[1] = 0;
  plVar1[2] = *in_RDI;
  if (*in_RDI != 0) {
    *(long **)(*in_RDI + 8) = plVar1;
  }
  *in_RDI = (long)plVar1;
  if (in_RDI[1] == 0) {
    in_RDI[1] = (long)plVar1;
  }
  *(long **)(in_RSI + (long)in_EDX * 8) = plVar1;
  *(int *)(in_RDI + 2) = (int)in_RDI[2] + 1;
  return;
}

Assistant:

void insert(AbstractSearchState *AbstractSearchState1, int listindex)
    {
        if (currentsize >= LISTSIZE) {
            throw SBPL_Exception("ERROR: list is full");
        }
        if (AbstractSearchState1->listelem[listindex] != NULL) {
            throw SBPL_Exception("ERROR: insert: element is already in the list");
        }
        listelement *insertelem = (listelement*)malloc(sizeof(listelement));
        insertelem->liststate = AbstractSearchState1;
        insertelem->prev = NULL;
        insertelem->next = firstelement;
        if (firstelement != NULL) firstelement->prev = insertelem;
        firstelement = insertelem;
        if (lastelement == NULL) //if this is the first element to be inserted into the list
        lastelement = insertelem;
        AbstractSearchState1->listelem[listindex] = insertelem;
        currentsize++;
    }